

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<short,double,duckdb::ArgMinMaxState<short,double>>
               (ArgMinMaxState<short,_double> *state,short x_data,double y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  double *in_RDX;
  undefined2 in_SI;
  undefined8 in_RDI;
  undefined1 x_null;
  TemplatedValidityMask<unsigned_long> *in_XMM0_Qa;
  double *in_stack_ffffffffffffffd8;
  undefined6 in_stack_fffffffffffffff0;
  
  x_null = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_XMM0_Qa,(idx_t)in_RDX);
  if ((bVar1) && (bVar1 = LessThan::Operation<double>(in_RDX,in_stack_ffffffffffffffd8), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_XMM0_Qa,(idx_t)in_RDX);
    Assign<short,double,duckdb::ArgMinMaxState<short,double>>
              ((ArgMinMaxState<short,_double> *)CONCAT26(in_SI,in_stack_fffffffffffffff0),
               (short *)in_XMM0_Qa,in_RDX,(bool)x_null);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}